

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::Parser::SupportsOptionalScalars(IDLOptions *opts)

{
  ulong uVar1;
  byte local_19;
  unsigned_long langs;
  IDLOptions *opts_local;
  
  uVar1 = opts->lang_to_generate;
  local_19 = 0;
  if ((uVar1 != 0) && (local_19 = 0, uVar1 < 0x80001)) {
    local_19 = (uVar1 & 0xfffffffffff41c50) != 0 ^ 0xff;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool Parser::SupportsOptionalScalars(const flatbuffers::IDLOptions &opts) {
  static FLATBUFFERS_CONSTEXPR unsigned long supported_langs =
      IDLOptions::kRust | IDLOptions::kSwift | IDLOptions::kLobster |
      IDLOptions::kKotlin | IDLOptions::kKotlinKmp | IDLOptions::kCpp |
      IDLOptions::kJava | IDLOptions::kCSharp | IDLOptions::kTs |
      IDLOptions::kBinary | IDLOptions::kGo | IDLOptions::kPython |
      IDLOptions::kJson |
      IDLOptions::kNim;
  unsigned long langs = opts.lang_to_generate;
  return (langs > 0 && langs < IDLOptions::kMAX) && !(langs & ~supported_langs);
}